

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-mpq.c
# Opt level: O0

void mpq_div(__mpq_struct *r,__mpq_struct *a,__mpq_struct *b)

{
  __mpq_struct *in_RSI;
  mpz_srcptr in_RDI;
  mpq_t t;
  __mpq_struct *in_stack_ffffffffffffffd0;
  __mpq_struct *in_stack_ffffffffffffffd8;
  __mpq_struct *in_stack_ffffffffffffffe0;
  
  mpq_roinit_zz(in_RSI,in_RDI,(mpz_srcptr)0x9af33e);
  mpq_mul(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void
mpq_div (mpq_t r, const mpq_t a, const mpq_t b)
{
  mpq_t t;
  mpq_mul (r, a, mpq_roinit_zz (t, mpq_denref (b), mpq_numref (b)));
}